

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

mem_expr_t find_mem_expr(gen_ctx_t gen_ctx,MIR_insn_t mem_insn)

{
  VARR_mem_expr_t *pVVar1;
  int iVar2;
  mem_expr_t pmVar3;
  ulong uVar4;
  mem_expr_t tab_e;
  mem_expr_t local_10;
  
  if (((*(uint *)&mem_insn->field_0x18 & 0xfffffffc) == 0) &&
     ((mem_insn->ops[0].field_0x8 == '\v' || (*(char *)&mem_insn[1].insn_link.prev == '\v')))) {
    pVVar1 = gen_ctx->gvn_ctx->mem_exprs;
    if ((pVVar1 != (VARR_mem_expr_t *)0x0) &&
       ((pVVar1->varr != (mem_expr_t *)0x0 &&
        (uVar4 = (ulong)*(uint *)((long)mem_insn->data + 0x10), uVar4 < pVVar1->els_num)))) {
      iVar2 = HTAB_mem_expr_t_do(gen_ctx->gvn_ctx->mem_expr_tab,pVVar1->varr[uVar4],HTAB_FIND,
                                 &local_10);
      pmVar3 = (mem_expr_t)0x0;
      if (iVar2 != 0) {
        pmVar3 = local_10;
      }
      return pmVar3;
    }
    find_mem_expr_cold_1();
  }
  __assert_fail("move_code_p (mem_insn->code) && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe90,"mem_expr_t find_mem_expr(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static mem_expr_t find_mem_expr (gen_ctx_t gen_ctx, MIR_insn_t mem_insn) {
  mem_expr_t tab_e, e;

  gen_assert (
    move_code_p (mem_insn->code)
    && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM));
  e = VARR_GET (mem_expr_t, mem_exprs, ((bb_insn_t) mem_insn->data)->mem_index);
  if (HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_FIND, tab_e)) return tab_e;
  return NULL;
}